

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

int __thiscall
unodb::detail::
olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::remove(olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  optimistic_lock *this_00;
  db_type *db_instance_local;
  uint8_t child_index_local;
  olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  this_00 = lock<unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                      (this);
  bVar1 = optimistic_lock::is_write_locked(this_00);
  if (!bVar1) {
    __assert_fail("lock(*this).is_write_locked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x50d,
                  "void unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>::remove(std::uint8_t, db_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  iVar2 = basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::remove(&this->
                    super_olc_inode_48_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                   ,(char *)((ulong)__filename & 0xff));
  return iVar2;
}

Assistant:

void remove(std::uint8_t child_index, db_type& db_instance) noexcept {
    UNODB_DETAIL_ASSERT(lock(*this).is_write_locked());

    parent_class::remove(child_index, db_instance);
  }